

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::NetParameter::MergePartialFromCodedStream(NetParameter *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  ArenaStringPtr *this_01;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  void *pvVar5;
  uint8 *puVar6;
  Arena *this_02;
  char *data;
  uint uVar7;
  bool bVar8;
  int iVar9;
  uint32 uVar10;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  NetState *this_06;
  unsigned_long uVar11;
  pair<int,_int> pVar12;
  string *psVar13;
  Type *pTVar14;
  UnknownFieldSet *unknown_fields;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  Rep *pRVar18;
  pair<unsigned_long,_bool> pVar19;
  
  this_00 = &this->input_;
  this_01 = &this->name_;
LAB_003f2682:
  pbVar4 = input->buffer_;
  uVar10 = 0;
  if (pbVar4 < input->buffer_end_) {
    bVar2 = *pbVar4;
    uVar10 = (uint32)bVar2;
    pbVar1 = pbVar4 + 1;
    uVar16 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar16) < 0x80)) goto LAB_003f2bec;
      uVar16 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar4 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar17 = (ulong)uVar16 | 0x100000000;
  }
  else {
LAB_003f2bec:
    uVar10 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar10);
    uVar17 = 0;
    if (uVar10 - 1 < 0x3fff) {
      uVar17 = 0x100000000;
    }
    uVar17 = uVar10 | uVar17;
  }
  uVar16 = (uint)uVar17;
  if ((uVar17 & 0x100000000) == 0) goto LAB_003f26e3;
  uVar7 = (uint)(uVar17 >> 3) & 0x1fffffff;
  cVar15 = (char)uVar17;
  switch(uVar7) {
  case 1:
    if (cVar15 == '\n') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar13 = (this->name_).ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_01->ptr_;
      }
      bVar8 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar8) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                 "caffe.NetParameter.name");
      goto LAB_003f2682;
    }
    break;
  case 2:
    if (cVar15 != '\x12') break;
    this_05 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                        (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar6 = input->buffer_;
    if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
      input->buffer_ = puVar6 + 1;
    }
    else {
      iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar9 < 0) {
        return false;
      }
    }
    pVar12 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                       (input,iVar9);
    if ((long)pVar12 < 0) {
      return false;
    }
    bVar8 = V1LayerParameter::MergePartialFromCodedStream(this_05,input);
LAB_003f2ab9:
    if (bVar8 == false) {
      return false;
    }
    bVar8 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar12.first);
    if (!bVar8) {
      return false;
    }
    goto LAB_003f2682;
  case 3:
    if (cVar15 == '\x1a') {
      pRVar18 = (this->input_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar18 == (Rep *)0x0) {
        iVar9 = (this->input_).super_RepeatedPtrFieldBase.total_size_;
LAB_003f2af6:
        google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,iVar9 + 1);
        pRVar18 = (this->input_).super_RepeatedPtrFieldBase.rep_;
        iVar9 = pRVar18->allocated_size;
LAB_003f2b08:
        pRVar18->allocated_size = iVar9 + 1;
        this_02 = (this_00->super_RepeatedPtrFieldBase).arena_;
        if (this_02 == (Arena *)0x0) {
          psVar13 = (string *)operator_new(0x20);
          (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
          psVar13->_M_string_length = 0;
          (psVar13->field_2)._M_local_buf[0] = '\0';
        }
        else {
          psVar13 = (string *)
                    google::protobuf::Arena::AllocateAligned
                              (this_02,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
          psVar13->_M_string_length = 0;
          (psVar13->field_2)._M_local_buf[0] = '\0';
          google::protobuf::Arena::AddListNode
                    (this_02,psVar13,
                     google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          pRVar18 = (this->input_).super_RepeatedPtrFieldBase.rep_;
        }
        iVar9 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
        (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
        pRVar18->elements[iVar9] = psVar13;
      }
      else {
        iVar3 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
        iVar9 = pRVar18->allocated_size;
        if (iVar9 <= iVar3) {
          if (iVar9 == (this->input_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003f2af6;
          goto LAB_003f2b08;
        }
        (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        psVar13 = (string *)pRVar18->elements[iVar3];
      }
      bVar8 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar8) {
        return false;
      }
      pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar14->_M_dataplus)._M_p;
      pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar14->_M_string_length,PARSE,"caffe.NetParameter.input");
      goto LAB_003f2682;
    }
    break;
  case 4:
    if (cVar15 == '\"') {
      bVar8 = google::protobuf::internal::WireFormatLite::
              ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,&this->input_dim_);
    }
    else {
      if ((uVar16 & 0xff) != 0x20) break;
      bVar8 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,0x20,input,&this->input_dim_);
    }
    goto LAB_003f2718;
  case 5:
    if (cVar15 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) &&
         (uVar11 = (unsigned_long)(char)*puVar6, -1 < (long)uVar11)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar19 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar11 = pVar19.first;
        if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->force_backward_ = uVar11 != 0;
      goto LAB_003f2682;
    }
    break;
  case 6:
    if (cVar15 == '2') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_06 = this->state_;
      if (this_06 == (NetState *)0x0) {
        this_06 = (NetState *)operator_new(0x38);
        NetState::NetState(this_06);
        this->state_ = this_06;
      }
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar9 < 0) {
          return false;
        }
      }
      pVar12 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar9);
      if ((long)pVar12 < 0) {
        return false;
      }
      bVar8 = NetState::MergePartialFromCodedStream(this_06,input);
      goto LAB_003f2ab9;
    }
    break;
  case 7:
    if (cVar15 == '8') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) &&
         (uVar11 = (unsigned_long)(char)*puVar6, -1 < (long)uVar11)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar19 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar11 = pVar19.first;
        if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->debug_info_ = uVar11 != 0;
      goto LAB_003f2682;
    }
    break;
  case 8:
    if (cVar15 == 'B') {
      this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                          (&(this->input_shape_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar9 < 0) {
          return false;
        }
      }
      pVar12 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar9);
      if ((long)pVar12 < 0) {
        return false;
      }
      bVar8 = BlobShape::MergePartialFromCodedStream(this_04,input);
      goto LAB_003f2ab9;
    }
    break;
  default:
    if ((uVar7 == 100) && (cVar15 == '\"')) {
      this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (&(this->layer_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar9 < 0) {
          return false;
        }
      }
      pVar12 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar9);
      if ((long)pVar12 < 0) {
        return false;
      }
      bVar8 = LayerParameter::MergePartialFromCodedStream(this_03,input);
      goto LAB_003f2ab9;
    }
  }
LAB_003f26e3:
  if (uVar16 == 0) {
    return true;
  }
  if ((uVar16 & 7) == 4) {
    return true;
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  bVar8 = google::protobuf::internal::WireFormat::SkipField(input,uVar16,unknown_fields);
LAB_003f2718:
  if (bVar8 == false) {
    return false;
  }
  goto LAB_003f2682;
}

Assistant:

bool NetParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.V1LayerParameter layers = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string input = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_input()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->input(this->input_size() - 1).data(),
            this->input(this->input_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.input");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 input_dim = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 32u, input, this->mutable_input_dim())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_input_dim())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_backward = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_force_backward();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_backward_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.NetState state = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_state()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool debug_info = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_debug_info();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &debug_info_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobShape input_shape = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_input_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.LayerParameter layer = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetParameter)
  return false;
#undef DO_
}